

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep_io.c
# Opt level: O1

int ARKStepSetTableNum(void *arkode_mem,ARKODE_DIRKTableID itable,ARKODE_ERKTableID etable)

{
  int iVar1;
  ARKodeButcherTable pAVar2;
  ARKodeButcherTable pAVar3;
  char *pcVar4;
  ARKodeARKStepMem step_mem;
  ARKodeMem ark_mem;
  sunindextype Bliw;
  sunindextype Blrw;
  ARKodeARKStepMem local_48;
  ARKodeMem local_40;
  int local_38;
  int local_34;
  
  iVar1 = arkStep_AccessStepMem(arkode_mem,"ARKStepSetTableNum",&local_40,&local_48);
  if (iVar1 != 0) {
    return iVar1;
  }
  local_48->stages = 0;
  local_48->q = 0;
  local_48->p = 0;
  ARKodeButcherTable_Space(local_48->Be,&local_38,&local_34);
  ARKodeButcherTable_Free(local_48->Be);
  local_48->Be = (ARKodeButcherTable)0x0;
  local_40->liw = local_40->liw - (long)local_38;
  local_40->lrw = local_40->lrw - (long)local_34;
  ARKodeButcherTable_Space(local_48->Bi,&local_38,&local_34);
  ARKodeButcherTable_Free(local_48->Bi);
  local_48->Bi = (ARKodeButcherTable)0x0;
  local_40->liw = local_40->liw - (long)local_38;
  local_40->lrw = local_40->lrw - (long)local_34;
  if ((etable & itable) < ~ARKODE_DIRK_NONE) {
    pcVar4 = "At least one valid table number must be supplied";
    goto LAB_003f7209;
  }
  if (itable < ~ARKODE_DIRK_NONE) {
    if ((uint)etable < 0xf) {
      pAVar2 = ARKodeButcherTable_LoadERK(etable);
      local_48->Be = pAVar2;
      if (pAVar2 == (ARKodeButcherTable)0x0) {
        pcVar4 = "Error setting explicit table with that index";
        goto LAB_003f7209;
      }
      local_48->stages = pAVar2->stages;
      iVar1 = pAVar2->p;
      local_48->q = pAVar2->q;
      local_48->p = iVar1;
      iVar1 = ARKStepSetExplicit(arkode_mem);
      if (iVar1 == 0) {
        return 0;
      }
      pcVar4 = "Error in ARKStepSetExplicit";
      goto LAB_003f7185;
    }
LAB_003f71bc:
    pcVar4 = "Illegal ERK table number";
    goto LAB_003f7209;
  }
  if (ARKODE_ERK_NONE < etable) {
    if ((((itable == ARKODE_ARK324L2SA_DIRK_4_2_3 && etable == ARKODE_ARK324L2SA_ERK_4_2_3) ||
         (itable == ARKODE_ARK436L2SA_DIRK_6_3_4 && etable == ARKODE_ARK436L2SA_ERK_6_3_4)) ||
        (itable == ARKODE_ARK437L2SA_DIRK_7_3_4 && etable == ARKODE_ARK437L2SA_ERK_7_3_4)) ||
       ((itable == ARKODE_ARK548L2SA_DIRK_8_4_5 && etable == ARKODE_ARK548L2SA_ERK_8_4_5 ||
        (itable == ARKODE_ARK548L2SAb_DIRK_8_4_5 && etable == ARKODE_ARK548L2SAb_ERK_8_4_5)))) {
      pAVar2 = ARKodeButcherTable_LoadDIRK(itable);
      local_48->Bi = pAVar2;
      pAVar3 = ARKodeButcherTable_LoadERK(etable);
      local_48->Be = pAVar3;
      pAVar2 = local_48->Bi;
      if (pAVar2 == (ARKodeButcherTable)0x0) goto LAB_003f719b;
      if (pAVar3 == (ARKodeButcherTable)0x0) goto LAB_003f71bc;
      local_48->stages = pAVar2->stages;
      iVar1 = pAVar2->p;
      local_48->q = pAVar2->q;
      local_48->p = iVar1;
      iVar1 = ARKStepSetImEx(arkode_mem);
      if (iVar1 == 0) {
        return 0;
      }
      pcVar4 = 
      "Cannot specify that method is ImEx without providing function pointers to fi(t,y) and fe(t,y)."
      ;
    }
    else {
      pcVar4 = "Incompatible Butcher tables for ARK method";
    }
    iVar1 = -0x16;
LAB_003f7185:
    arkProcessError(local_40,-0x16,"ARKode::ARKStep","ARKStepSetTableNum",pcVar4);
    return iVar1;
  }
  if (0xfffffff1 < (uint)(itable + ~ARKODE_ARK548L2SAb_DIRK_8_4_5)) {
    pAVar2 = ARKodeButcherTable_LoadDIRK(itable);
    local_48->Bi = pAVar2;
    if (pAVar2 != (ARKodeButcherTable)0x0) {
      local_48->stages = pAVar2->stages;
      iVar1 = pAVar2->p;
      local_48->q = pAVar2->q;
      local_48->p = iVar1;
      iVar1 = ARKStepSetImplicit(arkode_mem);
      if (iVar1 == 0) {
        return 0;
      }
      pcVar4 = "Error in ARKStepSetImplicit";
      goto LAB_003f7185;
    }
    pcVar4 = "Error setting table with that index";
    goto LAB_003f7209;
  }
LAB_003f719b:
  pcVar4 = "Illegal IRK table number";
LAB_003f7209:
  arkProcessError(local_40,-0x15,"ARKode::ARKStep","ARKStepSetTableNum",pcVar4);
  return -0x16;
}

Assistant:

int ARKStepSetTableNum(void *arkode_mem, ARKODE_DIRKTableID itable, ARKODE_ERKTableID etable)
{
  int flag, retval;
  ARKodeMem ark_mem;
  ARKodeARKStepMem step_mem;
  sunindextype Blrw, Bliw;

  /* access ARKodeARKStepMem structure */
  retval = arkStep_AccessStepMem(arkode_mem, "ARKStepSetTableNum",
                                 &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS)  return(retval);

  /* clear any existing parameters and Butcher tables */
  step_mem->stages = 0;
  step_mem->q = 0;
  step_mem->p = 0;

  ARKodeButcherTable_Space(step_mem->Be, &Bliw, &Blrw);
  ARKodeButcherTable_Free(step_mem->Be);
  step_mem->Be = NULL;
  ark_mem->liw -= Bliw;
  ark_mem->lrw -= Blrw;

  ARKodeButcherTable_Space(step_mem->Bi, &Bliw, &Blrw);
  ARKodeButcherTable_Free(step_mem->Bi);
  step_mem->Bi = NULL;
  ark_mem->liw -= Bliw;
  ark_mem->lrw -= Blrw;

  /* determine mode (implicit/explicit/ImEx), and perform
     appropriate actions  */

  /*     illegal inputs */
  if ((itable < 0) && (etable < 0)) {
    arkProcessError(ark_mem, ARK_MEM_NULL, "ARKode::ARKStep",
                    "ARKStepSetTableNum",
                    "At least one valid table number must be supplied");
    return(ARK_ILL_INPUT);


  /* explicit */
  } else if (itable < 0) {

    /* check that argument specifies an explicit table */
    if (etable<ARKODE_MIN_ERK_NUM || etable>ARKODE_MAX_ERK_NUM) {
      arkProcessError(ark_mem, ARK_MEM_NULL, "ARKode::ARKStep",
                      "ARKStepSetTableNum",
                      "Illegal ERK table number");
      return(ARK_ILL_INPUT);
    }

    /* fill in table based on argument */
    step_mem->Be = ARKodeButcherTable_LoadERK(etable);
    if (step_mem->Be == NULL) {
      arkProcessError(ark_mem, ARK_MEM_NULL, "ARKode::ARKStep",
                      "ARKStepSetTableNum",
                      "Error setting explicit table with that index");
      return(ARK_ILL_INPUT);
    }
    step_mem->stages = step_mem->Be->stages;
    step_mem->q = step_mem->Be->q;
    step_mem->p = step_mem->Be->p;

    /* set method as purely explicit */
    flag = ARKStepSetExplicit(arkode_mem);
    if (flag != ARK_SUCCESS) {
      arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode::ARKStep",
                      "ARKStepSetTableNum",
                      "Error in ARKStepSetExplicit");
      return(flag);
    }


  /* implicit */
  } else if (etable < 0) {

    /* check that argument specifies an implicit table */
    if (itable<ARKODE_MIN_DIRK_NUM || itable>ARKODE_MAX_DIRK_NUM) {
      arkProcessError(ark_mem, ARK_MEM_NULL, "ARKode::ARKStep",
                      "ARKStepSetTableNum",
                      "Illegal IRK table number");
      return(ARK_ILL_INPUT);
    }

    /* fill in table based on argument */
    step_mem->Bi = ARKodeButcherTable_LoadDIRK(itable);
    if (step_mem->Bi == NULL) {
      arkProcessError(ark_mem, ARK_MEM_NULL, "ARKode::ARKStep",
                      "ARKStepSetTableNum",
                      "Error setting table with that index");
      return(ARK_ILL_INPUT);
    }
    step_mem->stages = step_mem->Bi->stages;
    step_mem->q = step_mem->Bi->q;
    step_mem->p = step_mem->Bi->p;

    /* set method as purely implicit */
    flag = ARKStepSetImplicit(arkode_mem);
    if (flag != ARK_SUCCESS) {
      arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode::ARKStep",
                      "ARKStepSetTableNum",
                      "Error in ARKStepSetImplicit");
      return(flag);
    }


  /* ImEx */
  } else {

    /* ensure that tables match */
    if ( !((etable == ARKODE_ARK324L2SA_ERK_4_2_3) && (itable == ARKODE_ARK324L2SA_DIRK_4_2_3)) &&
         !((etable == ARKODE_ARK436L2SA_ERK_6_3_4) && (itable == ARKODE_ARK436L2SA_DIRK_6_3_4)) &&
         !((etable == ARKODE_ARK437L2SA_ERK_7_3_4) && (itable == ARKODE_ARK437L2SA_DIRK_7_3_4)) &&
         !((etable == ARKODE_ARK548L2SA_ERK_8_4_5) && (itable == ARKODE_ARK548L2SA_DIRK_8_4_5)) &&
         !((etable == ARKODE_ARK548L2SAb_ERK_8_4_5) && (itable == ARKODE_ARK548L2SAb_DIRK_8_4_5)) ) {
      arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode::ARKStep",
                      "ARKStepSetTableNum",
                      "Incompatible Butcher tables for ARK method");
      return(ARK_ILL_INPUT);
    }

    /* fill in tables based on arguments */
    step_mem->Bi = ARKodeButcherTable_LoadDIRK(itable);
    step_mem->Be = ARKodeButcherTable_LoadERK(etable);
    if (step_mem->Bi == NULL) {
      arkProcessError(ark_mem, ARK_MEM_NULL, "ARKode::ARKStep",
                      "ARKStepSetTableNum",
                      "Illegal IRK table number");
      return(ARK_ILL_INPUT);
    }
    if (step_mem->Be == NULL) {
      arkProcessError(ark_mem, ARK_MEM_NULL, "ARKode::ARKStep",
                      "ARKStepSetTableNum",
                      "Illegal ERK table number");
      return(ARK_ILL_INPUT);
    }
    step_mem->stages = step_mem->Bi->stages;
    step_mem->q = step_mem->Bi->q;
    step_mem->p = step_mem->Bi->p;

    /* set method as ImEx */
    if (ARKStepSetImEx(arkode_mem) != ARK_SUCCESS) {
      arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode::ARKStep",
                      "ARKStepSetTableNum", MSG_ARK_MISSING_F);
      return(ARK_ILL_INPUT);
    }

  }

  return(ARK_SUCCESS);
}